

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O1

MemChunk * __thiscall
cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::arenaAlloc
          (MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *this,size_type chunkSize)

{
  size_type *psVar1;
  SmallMemChunk *chunk;
  FixedArena *pFVar2;
  SmallMemChunk *pSVar3;
  SmallMemChunk *pSVar4;
  ulong uVar5;
  uint uVar6;
  SmallMemChunk *curr;
  MemSegment *pMVar7;
  ulong uVar8;
  
  uVar5 = chunkSize + 0x18;
  if ((chunkSize < 0xffffffffffffffe8) &&
     ((this->m_footprintLimit == 0 ||
      (uVar8 = this->m_footprint + uVar5,
      uVar8 <= this->m_footprintLimit && this->m_footprint < uVar8)))) {
    pFVar2 = this->m_arena;
    if ((pFVar2->m_used == false) && (uVar8 = pFVar2->m_size, uVar5 <= uVar8)) {
      pFVar2->m_used = true;
      pMVar7 = (MemSegment *)pFVar2->m_page;
    }
    else {
      pMVar7 = (MemSegment *)0x0;
      uVar8 = uVar5;
    }
    if (pMVar7 != (MemSegment *)0x0) {
      uVar5 = this->m_footprint + uVar8;
      this->m_footprint = uVar5;
      if (this->m_maxFootprint < uVar5) {
        this->m_maxFootprint = uVar5;
      }
      pMVar7->m_size = uVar8;
      pMVar7->m_pad = 1;
      pMVar7[1].m_size = uVar8 - 0x18;
      *(ulong *)((long)pMVar7 + (uVar8 - 8)) = uVar8 - 0x18;
      if (this->m_segList == (MemSegment *)0x0) {
        this->m_segList = pMVar7;
        pMVar7->m_next = (MemSegment *)0x0;
        this->m_release_checks = 0xfff;
      }
      else {
        pMVar7->m_next = this->m_segList;
        this->m_segList = pMVar7;
      }
      psVar1 = &pMVar7->m_pad;
      uVar8 = pMVar7[1].m_size & 0xfffffffffffffff0;
      uVar5 = uVar8 - chunkSize;
      if (uVar5 < 0x20) {
        return (MemChunk *)psVar1;
      }
      chunk = (SmallMemChunk *)((long)psVar1 + chunkSize);
      pMVar7[1].m_size = chunkSize;
      *(size_type *)((long)&pMVar7->m_pad + chunkSize) = chunkSize;
      *(ulong *)((long)&pMVar7[1].m_size + chunkSize) = uVar5;
      *(ulong *)((long)&pMVar7->m_pad + uVar8) = uVar5;
      if (0xff < uVar5) {
        addLargeChunk(this,(MemChunk *)chunk);
        return (MemChunk *)psVar1;
      }
      uVar6 = (uint)(uVar5 >> 3) & 0x1e;
      pSVar3 = this->m_smallLists[uVar6].m_head;
      if (pSVar3 == (SmallMemChunk *)0x0) {
        chunk->next = chunk;
        chunk->prev = chunk;
        this->m_smallLists[uVar6].m_head = chunk;
      }
      else {
        pSVar4 = pSVar3->next;
        pSVar3->next = chunk;
        pSVar4->prev = chunk;
        chunk->next = pSVar4;
        chunk->prev = pSVar3;
      }
      if ((this->m_smallMap >> uVar6 & 1) != 0) {
        return (MemChunk *)psVar1;
      }
      this->m_smallMap = this->m_smallMap | 1 << (sbyte)uVar6;
      return (MemChunk *)psVar1;
    }
  }
  return (MemChunk *)0x0;
}

Assistant:

MemChunk*
    arenaAlloc (size_type chunkSize)
    {
        size_type estSize;             /* allocation size */

        estSize = chunkSize + SEGMENT_OVERHEAD;
        if (estSize <= chunkSize)
        {
            // Technically can never reach here due to the MAX_REQUEST value
            //
            // However it is always good to have a check.
            return nullptr;
        }

        /*
         * Check user specified foot print limit
         */
        if (m_footprintLimit != 0)
        {
            size_type fp = m_footprint + estSize;
            if (fp <= m_footprint || fp > m_footprintLimit)
            {
                return nullptr;
            }
        }

        /*
         * Request memory segments from arena.
         */
        size_type segSize = estSize;
        MemSegment* seg = (MemSegment*)m_arena.getSegment (segSize);
        m_logger.logGetSegment (seg, segSize);

        /*
         * Initialize the segment obtained.
         */
        if (seg)
        {

            if ((m_footprint += segSize) > m_maxFootprint)
            {
                m_maxFootprint = m_footprint;
            }

            MemChunk* chunk = seg->init (segSize);

            if (m_segList == nullptr)
            {
                m_segList = seg;
                seg->setNext (nullptr);

                m_release_checks = MAX_RELEASE_CHECK_RATE;
            }
            else
            {
                seg->setNext (m_segList);
                m_segList = seg;
            }

            return splitChunk (chunk, chunkSize);
        }
        return nullptr;
    }